

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fc19c::BuildEngineImpl::dumpGraphToFile(BuildEngineImpl *this,string *path)

{
  BuildEngineDelegate *pBVar1;
  FILE *pFVar2;
  bool bVar3;
  char *pcVar4;
  iterator iVar5;
  iterator iVar6;
  reference ppRVar7;
  pointer pRVar8;
  DependencyKeyIDs *this_00;
  RuleInfo *pRVar9;
  char *pcVar10;
  KeyIDAndFlags KVar11;
  RuleInfo *dependency;
  undefined2 local_130;
  KeyIDAndFlags keyIDAndFlag;
  const_iterator __end3;
  const_iterator __begin3;
  DependencyKeyIDs *__range3;
  RuleInfo **ruleInfo;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
  *__range2_1;
  value_type local_b8;
  reference local_b0;
  pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo> *entry;
  iterator __end2;
  iterator __begin2;
  unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
  *__range2;
  vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
  orderedRuleInfos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Twine local_38;
  FILE *local_20;
  FILE *fp;
  string *path_local;
  BuildEngineImpl *this_local;
  
  fp = (FILE *)path;
  path_local = (string *)this;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  local_20 = fopen(pcVar4,"w");
  if (local_20 == (FILE *)0x0) {
    pBVar1 = this->delegate;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &orderedRuleInfos.
                    super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "unable to open graph output path \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fp);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &orderedRuleInfos.
                    super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"\"");
    llvm::Twine::Twine(&local_38,&local_58);
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string
              ((string *)
               &orderedRuleInfos.
                super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    fprintf(local_20,"digraph llbuild {\n");
    fprintf(local_20,"rankdir=\"LR\"\n");
    fprintf(local_20,"node [fontsize=10, shape=box, height=0.25]\n");
    fprintf(local_20,"edge [fontsize=10]\n");
    fprintf(local_20,"\n");
    std::
    vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
    ::vector((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
              *)&__range2);
    __end2 = std::
             unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
             ::begin(&this->ruleInfos);
    entry = (pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo> *)
            std::
            unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
            ::end(&this->ruleInfos);
    while( true ) {
      bVar3 = std::__detail::operator!=
                        (&__end2.
                          super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                         ,(_Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                           *)&entry);
      if (!bVar3) break;
      local_b0 = std::__detail::
                 _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
                 ::operator*(&__end2);
      local_b8 = &local_b0->second;
      std::
      vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
      ::push_back((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                   *)&__range2,&local_b8);
      std::__detail::
      _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
      ::operator++(&__end2);
    }
    iVar5 = std::
            vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
            ::begin((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                     *)&__range2);
    iVar6 = std::
            vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
            ::end((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                   *)&__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>
              (iVar5._M_current,iVar6._M_current);
    __end2_1 = std::
               vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
               ::begin((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                        *)&__range2);
    ruleInfo = (RuleInfo **)
               std::
               vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
               ::end((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                      *)&__range2);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_**,_std::vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>_>
                          *)&ruleInfo);
      if (!bVar3) break;
      ppRVar7 = __gnu_cxx::
                __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_**,_std::vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>_>
                ::operator*(&__end2_1);
      pFVar2 = local_20;
      pRVar8 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
               operator->(&(*ppRVar7)->rule);
      pcVar4 = llbuild::core::KeyType::c_str(&pRVar8->key);
      fprintf(pFVar2,"\"%s\"\n",pcVar4);
      this_00 = &((*ppRVar7)->result).dependencies;
      join_0x00000010_0x00000000_ = llbuild::core::DependencyKeyIDs::begin(this_00);
      join_0x00000010_0x00000000_ = llbuild::core::DependencyKeyIDs::end(this_00);
      while( true ) {
        bVar3 = llbuild::core::DependencyKeyIDs::const_iterator::operator!=
                          ((const_iterator *)&__end3.index,(const_iterator *)&keyIDAndFlag.orderOnly
                          );
        if (!bVar3) break;
        KVar11 = llbuild::core::DependencyKeyIDs::const_iterator::operator*
                           ((const_iterator *)&__end3.index);
        dependency = (RuleInfo *)KVar11.keyID._value;
        local_130 = KVar11._8_2_;
        keyIDAndFlag.keyID._value._0_2_ = local_130;
        pRVar9 = getRuleInfoForKey(this,(KeyID)dependency);
        pFVar2 = local_20;
        pRVar8 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 operator->(&(*ppRVar7)->rule);
        pcVar4 = llbuild::core::KeyType::c_str(&pRVar8->key);
        pRVar8 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 operator->(&pRVar9->rule);
        pcVar10 = llbuild::core::KeyType::c_str(&pRVar8->key);
        fprintf(pFVar2,"\"%s\" -> \"%s\"\n",pcVar4,pcVar10);
        llbuild::core::DependencyKeyIDs::const_iterator::operator++((const_iterator *)&__end3.index)
        ;
      }
      fprintf(local_20,"\n");
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_**,_std::vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>_>
      ::operator++(&__end2_1);
    }
    fprintf(local_20,"}\n");
    fclose(local_20);
    std::
    vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
    ::~vector((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
               *)&__range2);
  }
  return;
}

Assistant:

void dumpGraphToFile(const std::string& path) {
    FILE* fp = ::fopen(path.c_str(), "w");
    if (!fp) {
      delegate.error("unable to open graph output path \"" + path + "\"");
      return;
    }

    // Write the graph header.
    fprintf(fp, "digraph llbuild {\n");
    fprintf(fp, "rankdir=\"LR\"\n");
    fprintf(fp, "node [fontsize=10, shape=box, height=0.25]\n");
    fprintf(fp, "edge [fontsize=10]\n");
    fprintf(fp, "\n");

    // Create a canonical node ordering.
    std::vector<const RuleInfo*> orderedRuleInfos;
    for (const auto& entry: ruleInfos)
      orderedRuleInfos.push_back(&entry.second);
    std::sort(orderedRuleInfos.begin(), orderedRuleInfos.end(),
              [] (const RuleInfo* a, const RuleInfo* b) {
        return a->rule->key < b->rule->key;
      });

    // Write out all of the rules.
    for (const auto& ruleInfo: orderedRuleInfos) {
      fprintf(fp, "\"%s\"\n", ruleInfo->rule->key.c_str());
      for (auto keyIDAndFlag: ruleInfo->result.dependencies) {
        const auto& dependency = getRuleInfoForKey(keyIDAndFlag.keyID);
        fprintf(fp, "\"%s\" -> \"%s\"\n", ruleInfo->rule->key.c_str(),
                dependency.rule->key.c_str());
      }
      fprintf(fp, "\n");
    }

    // Write the footer and close.
    fprintf(fp, "}\n");
    fclose(fp);
  }